

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSurfaceNurbs.cpp
# Opt level: O3

void __thiscall
chrono::geometry::ChSurfaceNurbs::ArchiveIN(ChSurfaceNurbs *this,ChArchiveIn *marchive)

{
  char *local_38;
  int *local_30;
  undefined1 local_28;
  
  ChArchiveIn::VersionRead<chrono::geometry::ChSurfaceNurbs>(marchive);
  ChSurface::ArchiveIN(&this->super_ChSurface,marchive);
  local_30 = &this->p_u;
  local_38 = "p_u";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x18))(marchive,&local_38);
  local_30 = &this->p_v;
  local_38 = "p_v";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x18))(marchive,&local_38);
  return;
}

Assistant:

void ChSurfaceNurbs::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChSurfaceNurbs>();
    // deserialize parent class
    ChSurface::ArchiveIN(marchive);
    // stream in all member data:
    ////marchive >> CHNVP(points);
    ////marchive >> CHNVP(weights);
    ////marchive >> CHNVP(knots_u);
    ////marchive >> CHNVP(knots_v);
    marchive >> CHNVP(p_u);
    marchive >> CHNVP(p_v);
}